

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

aiLight * __thiscall Assimp::XGLImporter::ReadDirectionalLight(XGLImporter *this)

{
  bool bVar1;
  aiLight *this_00;
  pointer paVar2;
  aiVector3D aVar3;
  undefined1 local_88 [12];
  undefined1 local_7c [20];
  float local_68;
  _Base_ptr local_5c;
  float local_54;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *s;
  unique_ptr<aiLight,_std::default_delete<aiLight>_> local_18;
  unique_ptr<aiLight,_std::default_delete<aiLight>_> l;
  XGLImporter *this_local;
  
  l._M_t.super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight>_>._M_t.
  super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight>_>.
  super__Head_base<0UL,_aiLight_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiLight,_std::default_delete<aiLight>,_true,_true>)
       (__uniq_ptr_data<aiLight,_std::default_delete<aiLight>,_true,_true>)this;
  this_00 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(this_00);
  std::unique_ptr<aiLight,std::default_delete<aiLight>>::
  unique_ptr<std::default_delete<aiLight>,void>
            ((unique_ptr<aiLight,std::default_delete<aiLight>> *)&local_18,this_00);
  paVar2 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_18);
  paVar2->mType = aiLightSource_DIRECTIONAL;
  while (bVar1 = ReadElementUpToClosing(this,"directionallight"), bVar1) {
    GetElementName_abi_cxx11_(&local_50,this);
    local_30 = &local_50;
    bVar1 = std::operator==(local_30,"direction");
    if (bVar1) {
      aVar3 = ReadVec3(this);
      local_68 = aVar3.z;
      local_7c._12_8_ = aVar3._0_8_;
      local_5c = (_Base_ptr)local_7c._12_8_;
      local_54 = local_68;
      paVar2 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_18);
      *(_Base_ptr *)&paVar2->mDirection = local_5c;
      (paVar2->mDirection).z = local_54;
    }
    else {
      bVar1 = std::operator==(local_30,"diffuse");
      if (bVar1) {
        ReadCol3((XGLImporter *)local_7c);
        paVar2 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_18);
        aiColor3D::operator=(&paVar2->mColorDiffuse,(aiColor3D *)local_7c);
      }
      else {
        bVar1 = std::operator==(local_30,"specular");
        if (bVar1) {
          ReadCol3((XGLImporter *)local_88);
          paVar2 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_18);
          aiColor3D::operator=(&paVar2->mColorSpecular,(aiColor3D *)local_88);
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  paVar2 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::release(&local_18);
  std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::~unique_ptr(&local_18);
  return paVar2;
}

Assistant:

aiLight* XGLImporter::ReadDirectionalLight()
{
    std::unique_ptr<aiLight> l(new aiLight());
    l->mType = aiLightSource_DIRECTIONAL;

    while (ReadElementUpToClosing("directionallight"))  {
        const std::string& s = GetElementName();
        if (s == "direction") {
            l->mDirection = ReadVec3();
        }
        else if (s == "diffuse") {
            l->mColorDiffuse = ReadCol3();
        }
        else if (s == "specular") {
            l->mColorSpecular = ReadCol3();
        }
    }
    return l.release();
}